

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_interp.c
# Opt level: O3

REF_STATUS ref_interp_from_part(REF_INTERP ref_interp,REF_INT *to_part)

{
  REF_CELL *ref_cell_ptr;
  size_t sVar1;
  REF_MPI pRVar2;
  REF_GRID pRVar3;
  REF_NODE ref_node;
  REF_NODE pRVar4;
  REF_DBL *pRVar5;
  undefined1 auVar6 [16];
  REF_CELL ref_cell;
  uint uVar7;
  REF_INT *vector;
  long lVar8;
  void *pvVar9;
  REF_GLOB *pRVar10;
  ulong uVar11;
  undefined8 uVar12;
  long lVar13;
  REF_INT RVar14;
  char *pcVar15;
  long lVar16;
  ulong uVar17;
  REF_CELL *ref_cell_ptr_00;
  REF_INT *pRVar18;
  int iVar20;
  undefined1 auVar19 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  int iVar24;
  REF_INT local_19c;
  REF_INT n_donor;
  REF_INT n_recept;
  REF_MPI local_190;
  REF_DBL *local_188;
  REF_CELL local_180;
  REF_NODE local_178;
  REF_INT *recept_part;
  REF_INT n_find;
  REF_INT *local_160;
  REF_GRID local_158;
  REF_INT *donor_cell;
  REF_INT *donor_ret;
  REF_GLOB *local_140;
  REF_DBL *recept_bary;
  REF_GLOB *recept_global;
  REF_INT n_lookedup;
  long local_120;
  REF_INT *recept_cell;
  void *local_110;
  void *local_108;
  void *local_100;
  REF_INT *find_ret;
  REF_INT cell_node;
  REF_INT *local_e8;
  REF_INT *lookedup_cell;
  REF_INT *lookedup_donation;
  REF_GLOB *find_nodes;
  REF_INT *find_donation;
  REF_DBL *donor_bary;
  REF_GLOB *donor_global;
  REF_GRID local_b0;
  REF_INT nodes [27];
  
  pRVar2 = ref_interp->ref_mpi;
  local_158 = ref_interp->from_grid;
  pRVar3 = ref_interp->to_grid;
  ref_node = pRVar3->node;
  pRVar4 = local_158->node;
  local_180 = (&ref_interp->from_tet)[local_158->twod != 0];
  if ((ref_interp->max < ref_node->max) &&
     (uVar7 = ref_interp_resize(ref_interp,ref_node->max), uVar7 != 0)) {
    pcVar15 = "resize";
    uVar12 = 0xad3;
    goto LAB_001719c1;
  }
  uVar7 = pRVar4->max;
  if ((long)(int)uVar7 < 0) {
    pcVar15 = "malloc from_part of REF_INT negative";
    uVar12 = 0xad6;
LAB_00171d88:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",uVar12
           ,"ref_interp_from_part",pcVar15);
    return 1;
  }
  local_178 = pRVar4;
  local_b0 = pRVar3;
  vector = (REF_INT *)malloc((long)(int)uVar7 * 4);
  auVar6 = _DAT_0020f5d0;
  if (vector == (REF_INT *)0x0) {
    pcVar15 = "malloc from_part of REF_INT NULL";
    uVar12 = 0xad6;
  }
  else {
    if (uVar7 != 0) {
      lVar8 = (ulong)uVar7 - 1;
      auVar19._8_4_ = (int)lVar8;
      auVar19._0_8_ = lVar8;
      auVar19._12_4_ = (int)((ulong)lVar8 >> 0x20);
      lVar8 = 0;
      auVar19 = auVar19 ^ _DAT_0020f5d0;
      auVar21 = _DAT_0020f5b0;
      auVar22 = _DAT_0020f5c0;
      do {
        auVar23 = auVar22 ^ auVar6;
        iVar20 = auVar19._4_4_;
        if ((bool)(~(auVar23._4_4_ == iVar20 && auVar19._0_4_ < auVar23._0_4_ ||
                    iVar20 < auVar23._4_4_) & 1)) {
          *(undefined4 *)((long)vector + lVar8) = 0xffffffff;
        }
        if ((auVar23._12_4_ != auVar19._12_4_ || auVar23._8_4_ <= auVar19._8_4_) &&
            auVar23._12_4_ <= auVar19._12_4_) {
          *(undefined4 *)((long)vector + lVar8 + 4) = 0xffffffff;
        }
        auVar23 = auVar21 ^ auVar6;
        iVar24 = auVar23._4_4_;
        if (iVar24 <= iVar20 && (iVar24 != iVar20 || auVar23._0_4_ <= auVar19._0_4_)) {
          *(undefined4 *)((long)vector + lVar8 + 8) = 0xffffffff;
          *(undefined4 *)((long)vector + lVar8 + 0xc) = 0xffffffff;
        }
        lVar16 = auVar22._8_8_;
        auVar22._0_8_ = auVar22._0_8_ + 4;
        auVar22._8_8_ = lVar16 + 4;
        lVar16 = auVar21._8_8_;
        auVar21._0_8_ = auVar21._0_8_ + 4;
        auVar21._8_8_ = lVar16 + 4;
        lVar8 = lVar8 + 0x10;
      } while ((ulong)(uVar7 + 3 >> 2) << 4 != lVar8);
    }
    uVar7 = 0;
    n_recept = 0;
    iVar20 = ref_node->max;
    uVar17 = (ulong)iVar20;
    local_19c = 0;
    local_e8 = to_part;
    if (0 < (long)uVar17) {
      uVar11 = 0;
      uVar7 = 0;
      do {
        if (((-1 < ref_node->global[uVar11]) && (ref_node->ref_mpi->id == ref_node->part[uVar11]))
           && (ref_interp->cell[uVar11] != -1)) {
          uVar7 = uVar7 + 1;
          n_recept = uVar7;
        }
        uVar11 = uVar11 + 1;
        local_19c = (REF_INT)uVar11;
      } while (uVar17 != uVar11);
      if ((int)uVar7 < 0) {
        pcVar15 = "malloc recept_bary of REF_DBL negative";
        uVar12 = 0xadf;
        goto LAB_00171d88;
      }
    }
    recept_bary = (REF_DBL *)malloc((ulong)(uVar7 * 4) << 3);
    if (recept_bary == (REF_DBL *)0x0) {
      pcVar15 = "malloc recept_bary of REF_DBL NULL";
      uVar12 = 0xadf;
    }
    else {
      sVar1 = (ulong)uVar7 * 4;
      local_190 = pRVar2;
      local_188 = recept_bary;
      local_160 = (REF_INT *)malloc(sVar1);
      recept_cell = local_160;
      if (local_160 == (REF_INT *)0x0) {
        pcVar15 = "malloc recept_cell of REF_INT NULL";
        uVar12 = 0xae0;
      }
      else {
        local_140 = (REF_GLOB *)malloc((ulong)uVar7 << 3);
        recept_global = local_140;
        if (local_140 == (REF_GLOB *)0x0) {
          pcVar15 = "malloc recept_global of REF_GLOB NULL";
          uVar12 = 0xae1;
        }
        else {
          pvVar9 = malloc(sVar1);
          if (pvVar9 == (void *)0x0) {
            pcVar15 = "malloc recept_ret of REF_INT NULL";
            uVar12 = 0xae2;
          }
          else {
            recept_part = (REF_INT *)malloc(sVar1);
            pRVar2 = local_190;
            if (recept_part != (REF_INT *)0x0) {
              RVar14 = 0;
              n_recept = 0;
              local_19c = 0;
              if (0 < iVar20) {
                pRVar10 = ref_node->global;
                lVar8 = 0;
                uVar11 = 0;
                RVar14 = 0;
                do {
                  lVar16 = pRVar10[uVar11];
                  if (((-1 < lVar16) && (ref_node->ref_mpi->id == ref_node->part[uVar11])) &&
                     (iVar20 = ref_interp->cell[uVar11], iVar20 != -1)) {
                    pRVar5 = ref_interp->bary;
                    lVar13 = 0;
                    do {
                      local_188[RVar14 * 4 + lVar13] =
                           *(REF_DBL *)((long)pRVar5 + lVar13 * 8 + lVar8);
                      lVar13 = lVar13 + 1;
                    } while (lVar13 != 4);
                    lVar13 = (long)RVar14;
                    local_160[lVar13] = iVar20;
                    if (uVar17 <= uVar11) {
                      lVar16 = -1;
                    }
                    local_140[lVar13] = lVar16;
                    recept_part[lVar13] = ref_interp->part[uVar11];
                    *(REF_INT *)((long)pvVar9 + lVar13 * 4) = local_e8[uVar11];
                    RVar14 = RVar14 + 1;
                    n_recept = RVar14;
                  }
                  uVar11 = uVar11 + 1;
                  local_19c = (REF_INT)uVar11;
                  lVar8 = lVar8 + 0x20;
                } while (uVar11 < uVar17);
              }
              local_100 = pvVar9;
              uVar7 = ref_mpi_blindsend(local_190,recept_part,local_160,1,RVar14,&donor_cell,
                                        &n_donor,1);
              if (uVar7 == 0) {
                uVar7 = ref_mpi_blindsend(pRVar2,recept_part,local_100,1,n_recept,&donor_ret,
                                          &n_donor,1);
                if (uVar7 == 0) {
                  uVar7 = ref_mpi_blindsend(pRVar2,recept_part,recept_global,1,n_recept,
                                            &donor_global,&n_donor,2);
                  if (uVar7 == 0) {
                    uVar7 = ref_mpi_blindsend(pRVar2,recept_part,recept_bary,4,n_recept,&donor_bary,
                                              &n_donor,3);
                    RVar14 = n_donor;
                    if (uVar7 == 0) {
                      lVar8 = (long)n_donor;
                      if (lVar8 < 0) {
                        pcVar15 = "malloc donor_nodes of REF_GLOB negative";
                        uVar12 = 0xb01;
                        goto LAB_00171d88;
                      }
                      uVar7 = n_donor * 4;
                      pRVar10 = (REF_GLOB *)malloc((ulong)uVar7 * 8);
                      if (pRVar10 == (REF_GLOB *)0x0) {
                        pcVar15 = "malloc donor_nodes of REF_GLOB NULL";
                        uVar12 = 0xb01;
                      }
                      else {
                        if (RVar14 != 0) {
                          memset(pRVar10,0xff,(ulong)uVar7 << 3);
                        }
                        sVar1 = lVar8 * 4;
                        local_160 = (REF_INT *)malloc(sVar1);
                        if (local_160 == (REF_INT *)0x0) {
                          pcVar15 = "malloc donor_donation of REF_INT NULL";
                          uVar12 = 0xb02;
                        }
                        else {
                          local_140 = pRVar10;
                          local_188 = (REF_DBL *)malloc(sVar1);
                          if (local_188 == (REF_DBL *)0x0) {
                            pcVar15 = "malloc donor_part of REF_INT NULL";
                            uVar12 = 0xb03;
                          }
                          else {
                            local_108 = malloc(sVar1);
                            ref_cell = local_180;
                            if (local_108 != (void *)0x0) {
                              if (RVar14 != 0) {
                                lVar8 = 0;
                                do {
                                  uVar7 = ref_cell_nodes(ref_cell,donor_cell[lVar8],nodes);
                                  if (uVar7 != 0) {
                                    pcVar15 = "node needs to be localized";
                                    uVar12 = 0xb08;
                                    goto LAB_001719c1;
                                  }
                                  uVar17 = (ulong)ref_cell->node_per;
                                  if (0 < (long)uVar17) {
                                    RVar14 = donor_ret[lVar8];
                                    uVar11 = 0;
                                    do {
                                      vector[nodes[uVar11]] = RVar14;
                                      uVar11 = uVar11 + 1;
                                    } while (uVar11 < uVar17);
                                  }
                                  lVar8 = lVar8 + 1;
                                } while (lVar8 < n_donor);
                              }
                              uVar7 = ref_node_ghost_int(local_178,vector,1);
                              if (uVar7 == 0) {
                                uVar7 = ref_interp_fill_empty_from_part
                                                  ((REF_INTERP)ref_interp->ref_mpi,
                                                   (REF_INT *)ref_interp->from_grid);
                                if (uVar7 == 0) {
                                  if (0 < n_donor) {
                                    lVar8 = 0;
                                    do {
                                      uVar7 = ref_cell_nodes(local_180,donor_cell[lVar8],nodes);
                                      if (uVar7 != 0) {
                                        pcVar15 = "node needs to be localized";
                                        uVar12 = 0xb16;
                                        goto LAB_001719c1;
                                      }
                                      iVar20 = local_180->node_per;
                                      if (0 < (long)iVar20) {
                                        lVar16 = 0;
                                        do {
                                          iVar24 = nodes[lVar16];
                                          lVar13 = -1;
                                          if (((-1 < (long)iVar24) && (iVar24 < local_178->max)) &&
                                             (lVar13 = local_178->global[iVar24], lVar13 < 0)) {
                                            lVar13 = -1;
                                          }
                                          local_140[(ulong)((uint)lVar8 & 0x3fffffff) * 4 + lVar16]
                                               = lVar13;
                                          lVar16 = lVar16 + 1;
                                        } while (iVar20 != lVar16);
                                      }
                                      local_160[lVar8] = (uint)lVar8;
                                      uVar7 = ref_cell_part_cell_node
                                                        (local_180,local_178,donor_cell[lVar8],
                                                         &cell_node);
                                      if (uVar7 != 0) {
                                        pcVar15 = "part cell_node";
                                        uVar12 = 0xb1d;
                                        goto LAB_001719c1;
                                      }
                                      *(REF_INT *)((long)local_188 + lVar8 * 4) =
                                           vector[nodes[cell_node]];
                                      *(REF_INT *)((long)local_108 + lVar8 * 4) = local_190->id;
                                      lVar8 = lVar8 + 1;
                                    } while (lVar8 < n_donor);
                                  }
                                  iVar20 = local_178->max;
                                  if ((long)iVar20 < 1) {
                                    local_19c = 0;
                                  }
                                  else {
                                    uVar17 = 0;
                                    do {
                                      if ((-1 < local_178->global[uVar17]) && (vector[uVar17] == -1)
                                         ) {
                                        local_19c = (REF_INT)uVar17;
                                        pcVar15 = "from_part not set for node";
                                        uVar12 = 0xb24;
                                        goto LAB_00171d88;
                                      }
                                      uVar17 = uVar17 + 1;
                                    } while (uVar17 < (ulong)(long)iVar20);
                                    local_19c = 0;
                                    if (0 < iVar20) {
                                      pRVar18 = local_178->part;
                                      do {
                                        pRVar18[local_19c] = vector[local_19c];
                                        local_19c = local_19c + 1;
                                      } while (local_19c < local_178->max);
                                    }
                                  }
                                  uVar7 = ref_migrate_shufflin(local_158);
                                  if (uVar7 == 0) {
                                    if (ref_interp->from_cell_freeable != 0) {
                                      ref_cell_ptr_00 = &ref_interp->from_tri;
                                      ref_cell_ptr = &ref_interp->from_tet;
                                      ref_cell_free(*ref_cell_ptr_00);
                                      ref_cell_free(*ref_cell_ptr);
                                      uVar7 = ref_shard_extract_tri(local_158,ref_cell_ptr_00);
                                      if (uVar7 != 0) {
                                        pcVar15 = "shard tri";
                                        uVar12 = 0xb32;
                                        goto LAB_001719c1;
                                      }
                                      uVar7 = ref_shard_extract_tet(local_158,ref_cell_ptr);
                                      if (uVar7 != 0) {
                                        pcVar15 = "shard tet";
                                        uVar12 = 0xb34;
                                        goto LAB_001719c1;
                                      }
                                      if (local_158->twod == 0) {
                                        ref_cell_ptr_00 = ref_cell_ptr;
                                      }
                                      local_180 = *ref_cell_ptr_00;
                                    }
                                    uVar7 = ref_mpi_blindsend(local_190,(REF_INT *)local_188,
                                                              local_140,4,n_donor,&find_nodes,
                                                              &n_find,2);
                                    if (uVar7 == 0) {
                                      uVar7 = ref_mpi_blindsend(local_190,(REF_INT *)local_188,
                                                                local_160,1,n_donor,&find_donation,
                                                                &n_find,1);
                                      if (uVar7 == 0) {
                                        uVar7 = ref_mpi_blindsend(local_190,(REF_INT *)local_188,
                                                                  local_108,1,n_donor,&find_ret,
                                                                  &n_find,1);
                                        RVar14 = n_find;
                                        if (uVar7 == 0) {
                                          if ((long)n_find < 0) {
                                            pcVar15 = "malloc find_cell of REF_INT negative";
                                            uVar12 = 0xb48;
                                            goto LAB_00171d88;
                                          }
                                          local_110 = malloc((long)n_find * 4);
                                          if (local_110 == (void *)0x0) {
                                            pcVar15 = "malloc find_cell of REF_INT NULL";
                                            uVar12 = 0xb48;
                                            local_110 = (void *)0x0;
                                            goto LAB_00171e96;
                                          }
                                          if (RVar14 == 0) {
                                            RVar14 = 0;
                                          }
                                          else {
                                            local_120 = 0;
                                            do {
                                              if (0 < local_180->node_per) {
                                                local_158 = (REF_GRID)
                                                            ((ulong)((uint)local_120 & 0x3fffffff)
                                                            << 5);
                                                pRVar18 = nodes;
                                                lVar8 = 0;
                                                do {
                                                  uVar7 = ref_node_local(local_178,
                                                                         *(REF_GLOB *)
                                                                          ((long)find_nodes +
                                                                           (long)local_158 +
                                                                          lVar8 * 8),pRVar18);
                                                  if (uVar7 != 0) {
                                                    pcVar15 = "g2l";
                                                    uVar12 = 0xb4d;
                                                    goto LAB_001719c1;
                                                  }
                                                  lVar8 = lVar8 + 1;
                                                  pRVar18 = pRVar18 + 1;
                                                } while (lVar8 < local_180->node_per);
                                              }
                                              uVar7 = ref_cell_with(local_180,nodes,
                                                                    (REF_INT *)
                                                                    ((long)local_110 + local_120 * 4
                                                                    ));
                                              if (uVar7 != 0) {
                                                pcVar15 = "find cell with nodes";
                                                uVar12 = 0xb50;
                                                goto LAB_001719c1;
                                              }
                                              local_120 = local_120 + 1;
                                              RVar14 = n_find;
                                            } while (local_120 < n_find);
                                          }
                                          uVar7 = ref_mpi_blindsend(local_190,find_ret,local_110,1,
                                                                    RVar14,&lookedup_cell,
                                                                    &n_lookedup,1);
                                          if (uVar7 == 0) {
                                            uVar7 = ref_mpi_blindsend(local_190,find_ret,
                                                                      find_donation,1,n_find,
                                                                      &lookedup_donation,&n_lookedup
                                                                      ,1);
                                            if (uVar7 == 0) {
                                              if (0 < n_lookedup) {
                                                lVar8 = 0;
                                                do {
                                                  donor_cell[lookedup_donation[lVar8]] =
                                                       lookedup_cell[lVar8];
                                                  lVar8 = lVar8 + 1;
                                                } while (lVar8 < n_lookedup);
                                              }
                                              local_19c = 0;
                                              if (0 < ref_node->max) {
                                                pRVar18 = ref_node->part;
                                                do {
                                                  pRVar18[local_19c] = local_e8[local_19c];
                                                  local_19c = local_19c + 1;
                                                } while (local_19c < ref_node->max);
                                              }
                                              uVar7 = ref_migrate_shufflin(local_b0);
                                              if (uVar7 == 0) {
                                                uVar7 = ref_interp_reset(ref_interp);
                                                if (uVar7 == 0) {
                                                  if (recept_part != (REF_INT *)0x0) {
                                                    free(recept_part);
                                                  }
                                                  if (recept_global != (REF_GLOB *)0x0) {
                                                    free(recept_global);
                                                  }
                                                  if (recept_cell != (REF_INT *)0x0) {
                                                    free(recept_cell);
                                                  }
                                                  if (recept_bary != (REF_DBL *)0x0) {
                                                    free(recept_bary);
                                                  }
                                                  uVar7 = ref_mpi_blindsend(local_190,donor_ret,
                                                                            donor_cell,1,n_donor,
                                                                            &recept_cell,&n_recept,1
                                                                           );
                                                  if (uVar7 == 0) {
                                                    uVar7 = ref_mpi_blindsend(local_190,donor_ret,
                                                                              donor_global,1,n_donor
                                                                              ,&recept_global,
                                                                              &n_recept,2);
                                                    if (uVar7 == 0) {
                                                      uVar7 = ref_mpi_blindsend(local_190,donor_ret,
                                                                                local_188,1,n_donor,
                                                                                &recept_part,
                                                                                &n_recept,1);
                                                      if (uVar7 == 0) {
                                                        uVar7 = ref_mpi_blindsend(local_190,
                                                                                  donor_ret,
                                                                                  donor_bary,4,
                                                                                  n_donor,&
                                                  recept_bary,&n_recept,3);
                                                  if (uVar7 == 0) {
                                                    if (0 < n_recept) {
                                                      lVar8 = 0;
                                                      lVar16 = 0;
                                                      do {
                                                        uVar7 = ref_node_local(ref_node,
                                                  recept_global[lVar16],&local_19c);
                                                  if (uVar7 != 0) {
                                                    pcVar15 = "g2l";
                                                    uVar12 = 0xb7c;
                                                    goto LAB_001719c1;
                                                  }
                                                  ref_interp->cell[local_19c] = recept_cell[lVar16];
                                                  ref_interp->part[local_19c] = recept_part[lVar16];
                                                  pRVar5 = ref_interp->bary;
                                                  lVar13 = 0;
                                                  do {
                                                    pRVar5[(long)local_19c * 4 + lVar13] =
                                                         *(REF_DBL *)
                                                          ((long)recept_bary + lVar13 * 8 + lVar8);
                                                    lVar13 = lVar13 + 1;
                                                  } while (lVar13 != 4);
                                                  lVar16 = lVar16 + 1;
                                                  lVar8 = lVar8 + 0x20;
                                                  } while (lVar16 < n_recept);
                                                  }
                                                  uVar7 = ref_search_free(ref_interp->ref_search);
                                                  if (uVar7 == 0) {
                                                    uVar7 = ref_interp_create_search(ref_interp);
                                                    if (uVar7 == 0) {
                                                      if (lookedup_donation != (REF_INT *)0x0) {
                                                        free(lookedup_donation);
                                                      }
                                                      if (lookedup_cell != (REF_INT *)0x0) {
                                                        free(lookedup_cell);
                                                      }
                                                      free(local_110);
                                                      if (find_ret != (REF_INT *)0x0) {
                                                        free(find_ret);
                                                      }
                                                      if (find_donation != (REF_INT *)0x0) {
                                                        free(find_donation);
                                                      }
                                                      if (find_nodes != (REF_GLOB *)0x0) {
                                                        free(find_nodes);
                                                      }
                                                      free(local_108);
                                                      free(local_188);
                                                      free(local_160);
                                                      free(local_140);
                                                      if (donor_bary != (REF_DBL *)0x0) {
                                                        free(donor_bary);
                                                      }
                                                      if (donor_global != (REF_GLOB *)0x0) {
                                                        free(donor_global);
                                                      }
                                                      if (donor_ret != (REF_INT *)0x0) {
                                                        free(donor_ret);
                                                      }
                                                      if (donor_cell != (REF_INT *)0x0) {
                                                        free(donor_cell);
                                                      }
                                                      if (recept_part != (REF_INT *)0x0) {
                                                        free(recept_part);
                                                      }
                                                      free(local_100);
                                                      if (recept_global != (REF_GLOB *)0x0) {
                                                        free(recept_global);
                                                      }
                                                      if (recept_cell != (REF_INT *)0x0) {
                                                        free(recept_cell);
                                                      }
                                                      if (recept_bary != (REF_DBL *)0x0) {
                                                        free(recept_bary);
                                                      }
                                                      free(vector);
                                                      return 0;
                                                    }
                                                    pcVar15 = "(re)build search tree";
                                                    uVar12 = 0xb86;
                                                  }
                                                  else {
                                                    pcVar15 = "free search tree";
                                                    uVar12 = 0xb85;
                                                  }
                                                  }
                                                  else {
                                                    pcVar15 = "blind send cell";
                                                    uVar12 = 0xb79;
                                                  }
                                                  }
                                                  else {
                                                    pcVar15 = "blind send cell";
                                                    uVar12 = 0xb76;
                                                  }
                                                  }
                                                  else {
                                                    pcVar15 = "blind send cell";
                                                    uVar12 = 0xb73;
                                                  }
                                                  }
                                                  else {
                                                    pcVar15 = "blind send cell";
                                                    uVar12 = 0xb70;
                                                  }
                                                }
                                                else {
                                                  pcVar15 = "ref_interp resize/reset";
                                                  uVar12 = 0xb67;
                                                }
                                              }
                                              else {
                                                pcVar15 = "shufflin to grid";
                                                uVar12 = 0xb64;
                                              }
                                            }
                                            else {
                                              pcVar15 = "blind send cell";
                                              uVar12 = 0xb59;
                                            }
                                          }
                                          else {
                                            pcVar15 = "blind send cell";
                                            uVar12 = 0xb55;
                                          }
                                        }
                                        else {
                                          pcVar15 = "blind send cell";
                                          uVar12 = 0xb46;
                                        }
                                      }
                                      else {
                                        pcVar15 = "blind send cell";
                                        uVar12 = 0xb43;
                                      }
                                    }
                                    else {
                                      pcVar15 = "blind send cell";
                                      uVar12 = 0xb40;
                                    }
                                  }
                                  else {
                                    pcVar15 = "shufflin from grid";
                                    uVar12 = 0xb2c;
                                  }
                                }
                                else {
                                  pcVar15 = "fill part";
                                  uVar12 = 0xb10;
                                }
                              }
                              else {
                                pcVar15 = "ghost from_part";
                                uVar12 = 0xb0d;
                              }
                              goto LAB_001719c1;
                            }
                            pcVar15 = "malloc donor_origpart of REF_INT NULL";
                            uVar12 = 0xb04;
                          }
                        }
                      }
                      goto LAB_00171e96;
                    }
                    pcVar15 = "blind send bary";
                    uVar12 = 0xaff;
                  }
                  else {
                    pcVar15 = "blind send global";
                    uVar12 = 0xafc;
                  }
                }
                else {
                  pcVar15 = "blind send ret";
                  uVar12 = 0xaf8;
                }
              }
              else {
                pcVar15 = "blind send cell";
                uVar12 = 0xaf5;
              }
LAB_001719c1:
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                     ,uVar12,"ref_interp_from_part",(ulong)uVar7,pcVar15);
              return uVar7;
            }
            pcVar15 = "malloc recept_part of REF_INT NULL";
            uVar12 = 0xae3;
          }
        }
      }
    }
  }
LAB_00171e96:
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",uVar12,
         "ref_interp_from_part",pcVar15);
  return 2;
}

Assistant:

REF_FCN REF_STATUS ref_interp_from_part(REF_INTERP ref_interp,
                                        REF_INT *to_part) {
  REF_MPI ref_mpi = ref_interp_mpi(ref_interp);
  REF_GRID to_grid = ref_interp_to_grid(ref_interp);
  REF_GRID from_grid = ref_interp_from_grid(ref_interp);
  REF_NODE to_node = ref_grid_node(to_grid);
  REF_NODE from_node = ref_grid_node(from_grid);
  REF_CELL from_cell;
  REF_INT node, i, cell_node;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT *from_part;
  REF_INT recept, n_recept, donation, n_donor;
  REF_INT find, n_find, lookedup, n_lookedup;
  REF_INT *donor_ret, *donor_cell, *donor_donation, *donor_part,
      *donor_origpart;
  REF_INT *recept_part, *recept_ret, *recept_cell;
  REF_GLOB *recept_global, *donor_global, *donor_nodes;
  REF_DBL *recept_bary, *donor_bary;
  REF_INT *find_ret, *find_donation, *find_cell;
  REF_GLOB *find_nodes;
  REF_INT *lookedup_donation, *lookedup_cell;
  REF_DBL max_error = -1.0;
  REF_BOOL report_migration_volume = REF_FALSE;
  REF_BOOL report_interp_error = REF_FALSE;

  if (ref_grid_twod(from_grid)) {
    from_cell = ref_interp_from_tri(ref_interp);
  } else {
    from_cell = ref_interp_from_tet(ref_interp);
  }

  if (report_interp_error) {
    RSS(ref_interp_max_error(ref_interp, &max_error), "max error");
    if (ref_mpi_once(ref_grid_mpi(to_grid))) {
      printf("starting %e max error\n", max_error);
    }
  }

  if (ref_node_max(to_node) > ref_interp_max(ref_interp)) {
    RSS(ref_interp_resize(ref_interp, ref_node_max(to_node)), "resize");
  }

  ref_malloc_init(from_part, ref_node_max(from_node), REF_INT, REF_EMPTY);

  n_recept = 0;
  each_ref_node_valid_node(to_node, node) {
    if (ref_node_owned(to_node, node) && REF_EMPTY != ref_interp->cell[node]) {
      n_recept++;
    }
  }

  ref_malloc(recept_bary, 4 * n_recept, REF_DBL);
  ref_malloc(recept_cell, n_recept, REF_INT);
  ref_malloc(recept_global, n_recept, REF_GLOB);
  ref_malloc(recept_ret, n_recept, REF_INT);
  ref_malloc(recept_part, n_recept, REF_INT);

  n_recept = 0;
  each_ref_node_valid_node(to_node, node) {
    if (ref_node_owned(to_node, node) && REF_EMPTY != ref_interp->cell[node]) {
      for (i = 0; i < 4; i++) {
        recept_bary[i + 4 * n_recept] = ref_interp->bary[i + 4 * node];
      }
      recept_cell[n_recept] = ref_interp->cell[node];
      recept_global[n_recept] = ref_node_global(to_node, node);
      recept_part[n_recept] = ref_interp->part[node];
      recept_ret[n_recept] = to_part[node];
      n_recept++;
    }
  }

  RSS(ref_mpi_blindsend(ref_mpi, recept_part, (void *)recept_cell, 1, n_recept,
                        (void **)(&donor_cell), &n_donor, REF_INT_TYPE),
      "blind send cell");
  RSS(ref_mpi_blindsend(ref_mpi, recept_part, (void *)recept_ret, 1, n_recept,
                        (void **)(&donor_ret), &n_donor, REF_INT_TYPE),
      "blind send ret");
  RSS(ref_mpi_blindsend(ref_mpi, recept_part, (void *)recept_global, 1,
                        n_recept, (void **)(&donor_global), &n_donor,
                        REF_GLOB_TYPE),
      "blind send global");
  RSS(ref_mpi_blindsend(ref_mpi, recept_part, (void *)recept_bary, 4, n_recept,
                        (void **)(&donor_bary), &n_donor, REF_DBL_TYPE),
      "blind send bary");

  ref_malloc_init(donor_nodes, 4 * n_donor, REF_GLOB, REF_EMPTY);
  ref_malloc(donor_donation, n_donor, REF_INT);
  ref_malloc(donor_part, n_donor, REF_INT);
  ref_malloc(donor_origpart, n_donor, REF_INT);

  for (donation = 0; donation < n_donor; donation++) {
    RSS(ref_cell_nodes(from_cell, donor_cell[donation], nodes),
        "node needs to be localized");
    for (i = 0; i < ref_cell_node_per(from_cell); i++) {
      from_part[nodes[i]] = donor_ret[donation];
    }
  }
  RSS(ref_node_ghost_int(from_node, from_part, 1), "ghost from_part");
  if (report_migration_volume)
    RSS(ref_interp_from_part_status(ref_interp, from_part), "from part status");
  RSS(ref_interp_fill_empty_from_part(ref_interp, from_part), "fill part");
  if (report_migration_volume)
    RSS(ref_interp_from_part_status(ref_interp, from_part), "from part status");

  for (donation = 0; donation < n_donor; donation++) {
    RSS(ref_cell_nodes(from_cell, donor_cell[donation], nodes),
        "node needs to be localized");
    for (i = 0; i < ref_cell_node_per(from_cell); i++) {
      donor_nodes[i + 4 * donation] = ref_node_global(from_node, nodes[i]);
    }
    donor_donation[donation] = donation;
    RSS(ref_cell_part_cell_node(from_cell, from_node, donor_cell[donation],
                                &cell_node),
        "part cell_node");
    donor_part[donation] = from_part[nodes[cell_node]];
    donor_origpart[donation] = ref_mpi_rank(ref_mpi);
  }

  /* ensure parts of from_node are set */
  each_ref_node_valid_node(from_node, node) {
    RUS(REF_EMPTY, from_part[node], "from_part not set for node");
  }

  /* set parts of from_node */
  for (node = 0; node < ref_node_max(from_node); node++)
    ref_node_part(from_node, node) = from_part[node];

  /* shuffle from_node */
  RSS(ref_migrate_shufflin(from_grid), "shufflin from grid");

  if (ref_interp_from_cell_freeable(ref_interp)) {
    ref_cell_free(ref_interp_from_tri(ref_interp));
    ref_cell_free(ref_interp_from_tet(ref_interp));
    RSS(ref_shard_extract_tri(from_grid, &ref_interp_from_tri(ref_interp)),
        "shard tri");
    RSS(ref_shard_extract_tet(from_grid, &ref_interp_from_tet(ref_interp)),
        "shard tet");
    if (ref_grid_twod(from_grid)) {
      from_cell = ref_interp_from_tri(ref_interp);
    } else {
      from_cell = ref_interp_from_tet(ref_interp);
    }
  }

  /* use new from part to translate nodes to cell (back and forth) */

  RSS(ref_mpi_blindsend(ref_mpi, donor_part, (void *)donor_nodes, 4, n_donor,
                        (void **)(&find_nodes), &n_find, REF_GLOB_TYPE),
      "blind send cell");
  RSS(ref_mpi_blindsend(ref_mpi, donor_part, (void *)donor_donation, 1, n_donor,
                        (void **)(&find_donation), &n_find, REF_INT_TYPE),
      "blind send cell");
  RSS(ref_mpi_blindsend(ref_mpi, donor_part, (void *)donor_origpart, 1, n_donor,
                        (void **)(&find_ret), &n_find, REF_INT_TYPE),
      "blind send cell");

  ref_malloc(find_cell, n_find, REF_INT);

  for (find = 0; find < n_find; find++) {
    for (i = 0; i < ref_cell_node_per(from_cell); i++) {
      RSS(ref_node_local(from_node, find_nodes[i + 4 * find], &(nodes[i])),
          "g2l");
    }
    RSS(ref_cell_with(from_cell, nodes, &(find_cell[find])),
        "find cell with nodes");
  }

  RSS(ref_mpi_blindsend(ref_mpi, find_ret, (void *)find_cell, 1, n_find,
                        (void **)(&lookedup_cell), &n_lookedup, REF_INT_TYPE),
      "blind send cell");
  RSS(ref_mpi_blindsend(ref_mpi, find_ret, (void *)find_donation, 1, n_find,
                        (void **)(&lookedup_donation), &n_lookedup,
                        REF_INT_TYPE),
      "blind send cell");

  for (lookedup = 0; lookedup < n_lookedup; lookedup++) {
    donor_cell[lookedup_donation[lookedup]] = lookedup_cell[lookedup];
  }

  /* shuffle to */
  for (node = 0; node < ref_node_max(to_node); node++) {
    ref_node_part(to_node, node) = to_part[node];
  }

  RSS(ref_migrate_shufflin(to_grid), "shufflin to grid");

  /* return from data to to grid and refill ref_interp->data */
  RSS(ref_interp_reset(ref_interp), "ref_interp resize/reset");

  ref_free(recept_part);
  ref_free(recept_global);
  ref_free(recept_cell);
  ref_free(recept_bary);

  RSS(ref_mpi_blindsend(ref_mpi, donor_ret, (void *)donor_cell, 1, n_donor,
                        (void **)(&recept_cell), &n_recept, REF_INT_TYPE),
      "blind send cell");
  RSS(ref_mpi_blindsend(ref_mpi, donor_ret, (void *)donor_global, 1, n_donor,
                        (void **)(&recept_global), &n_recept, REF_GLOB_TYPE),
      "blind send cell");
  RSS(ref_mpi_blindsend(ref_mpi, donor_ret, (void *)donor_part, 1, n_donor,
                        (void **)(&recept_part), &n_recept, REF_INT_TYPE),
      "blind send cell");
  RSS(ref_mpi_blindsend(ref_mpi, donor_ret, (void *)donor_bary, 4, n_donor,
                        (void **)(&recept_bary), &n_recept, REF_DBL_TYPE),
      "blind send cell");

  for (recept = 0; recept < n_recept; recept++) {
    RSS(ref_node_local(to_node, recept_global[recept], &node), "g2l");
    ref_interp->cell[node] = recept_cell[recept];
    ref_interp->part[node] = recept_part[recept];
    for (i = 0; i < 4; i++) {
      ref_interp->bary[i + 4 * node] = recept_bary[i + 4 * recept];
    }
  }

  /* remake interp search tree */
  RSS(ref_search_free(ref_interp_search(ref_interp)), "free search tree");
  RSS(ref_interp_create_search(ref_interp), "(re)build search tree");

  ref_free(lookedup_donation);
  ref_free(lookedup_cell);

  ref_free(find_cell);
  ref_free(find_ret);
  ref_free(find_donation);
  ref_free(find_nodes);

  ref_free(donor_origpart);
  ref_free(donor_part);
  ref_free(donor_donation);
  ref_free(donor_nodes);
  ref_free(donor_bary);
  ref_free(donor_global);
  ref_free(donor_ret);
  ref_free(donor_cell);

  ref_free(recept_part);
  ref_free(recept_ret);
  ref_free(recept_global);
  ref_free(recept_cell);
  ref_free(recept_bary);

  ref_free(from_part);

  if (report_interp_error) {
    RSS(ref_interp_max_error(ref_interp, &max_error), "max error");
    if (ref_mpi_once(ref_grid_mpi(to_grid))) {
      printf("final %e max error\n", max_error);
    }
  }

  return REF_SUCCESS;
}